

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
perfetto::protos::gen::IPCFrame_BindServiceReply_MethodInfo::IPCFrame_BindServiceReply_MethodInfo
          (IPCFrame_BindServiceReply_MethodInfo *this,IPCFrame_BindServiceReply_MethodInfo *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__IPCFrame_BindServiceReply_MethodInfo_003c9a38;
  this->id_ = param_2->id_;
  paVar1 = &(this->name_).field_2;
  (this->name_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (param_2->name_)._M_dataplus._M_p;
  paVar2 = &(param_2->name_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(param_2->name_).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->name_).field_2 + 8) = uVar4;
  }
  else {
    (this->name_)._M_dataplus._M_p = pcVar3;
    (this->name_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->name_)._M_string_length = (param_2->name_)._M_string_length;
  (param_2->name_)._M_dataplus._M_p = (pointer)paVar2;
  (param_2->name_)._M_string_length = 0;
  (param_2->name_).field_2._M_local_buf[0] = '\0';
  paVar1 = &(this->unknown_fields_).field_2;
  (this->unknown_fields_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (param_2->unknown_fields_)._M_dataplus._M_p;
  paVar2 = &(param_2->unknown_fields_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(param_2->unknown_fields_).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->unknown_fields_).field_2 + 8) = uVar4;
  }
  else {
    (this->unknown_fields_)._M_dataplus._M_p = pcVar3;
    (this->unknown_fields_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->unknown_fields_)._M_string_length = (param_2->unknown_fields_)._M_string_length;
  (param_2->unknown_fields_)._M_dataplus._M_p = (pointer)paVar2;
  (param_2->unknown_fields_)._M_string_length = 0;
  (param_2->unknown_fields_).field_2._M_local_buf[0] = '\0';
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_2->_has_field_).super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

IPCFrame_BindServiceReply_MethodInfo::IPCFrame_BindServiceReply_MethodInfo(IPCFrame_BindServiceReply_MethodInfo&&) noexcept = default;